

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ircbot.cpp
# Opt level: O0

bool __thiscall ircBot::checkping(ircBot *this,char *buff)

{
  int __fd;
  size_t sVar1;
  bool bVar2;
  char local_78 [8];
  char Pingout [60];
  int local_30;
  int local_2c;
  int x;
  int i;
  char *toSearch;
  char *buff_local;
  ircBot *this_local;
  
  for (local_2c = 0; sVar1 = strlen(buff), (ulong)(long)local_2c < sVar1; local_2c = local_2c + 1) {
    if (buff[local_2c] == 'P') {
      found = true;
      for (local_30 = 1; local_30 < 4; local_30 = local_30 + 1) {
        if (buff[local_2c + local_30] != "PING "[local_30]) {
          found = false;
        }
      }
    }
  }
  printf("\n%s\n");
  memset(local_78,0,0x3c);
  bVar2 = (found & 1U) == 1;
  if (bVar2) {
    snprintf(local_78,0x3c,"PONG :%s\r\n");
    __fd = this->sock;
    sVar1 = strlen(local_78);
    send(__fd,local_78,sVar1,0);
    printf("PONG: %s\r\n\n",irchost);
  }
  return bVar2;
}

Assistant:

bool ircBot::checkping(char *buff)
{
    
    const char * toSearch = "PING ";

    for (int i = 0; i < strlen(buff);i++) {
    //If the active char is equil to the first search item then search toSearch
            if (buff[i] == toSearch[0]) {
                found = true;
                //search the char array for search field
                for (int x = 1; x < 4; x++) {
                    if (buff[i+x]!=toSearch[x]) {
                    found = false;
                    }
                }
            }
    }

    printf("\n%s\n", buff);
    char Pingout[60];
    memset(Pingout,'\0',60);
    if(found == true)
    {
        snprintf(Pingout,60,"PONG :%s\r\n",buff);
        send(sock,Pingout,strlen(Pingout),0);
        printf("PONG: %s\r\n\n", irchost);
        return 1;
    }
    return 0;
}